

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_string_parser.c
# Opt level: O1

MAP_HANDLE connectionstringparser_parse(STRING_HANDLE connection_string)

{
  bool bVar1;
  int iVar2;
  MAP_RESULT MVar3;
  STRING_TOKENIZER_HANDLE_conflict tokenizer;
  STRING_HANDLE output;
  STRING_HANDLE output_00;
  MAP_HANDLE handle;
  LOGGER_LOG p_Var4;
  char *value;
  char *pcVar5;
  
  if (connection_string == (STRING_HANDLE)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return (MAP_HANDLE)0x0;
    }
    pcVar5 = "NULL connection string passed to tokenizer.";
    iVar2 = 0x2b;
  }
  else {
    tokenizer = STRING_TOKENIZER_create(connection_string);
    if (tokenizer != (STRING_TOKENIZER_HANDLE_conflict)0x0) {
      output = STRING_new();
      if (output == (STRING_HANDLE)0x0) {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 == (LOGGER_LOG)0x0) {
          handle = (MAP_HANDLE)0x0;
        }
        else {
          handle = (MAP_HANDLE)0x0;
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/connection_string_parser.c"
                    ,"connectionstringparser_parse",0x40,1,"Error creating key token STRING.");
        }
      }
      else {
        output_00 = STRING_new();
        if (output_00 == (STRING_HANDLE)0x0) {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 == (LOGGER_LOG)0x0) {
            handle = (MAP_HANDLE)0x0;
          }
          else {
            handle = (MAP_HANDLE)0x0;
            (*p_Var4)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/connection_string_parser.c"
                      ,"connectionstringparser_parse",0x49,1,"Error creating value token STRING.");
          }
        }
        else {
          handle = Map_Create((MAP_FILTER_CALLBACK)0x0);
          if (handle == (MAP_HANDLE)0x0) {
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 == (LOGGER_LOG)0x0) {
              handle = (MAP_HANDLE)0x0;
            }
            else {
              handle = (MAP_HANDLE)0x0;
              (*p_Var4)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/connection_string_parser.c"
                        ,"connectionstringparser_parse",0x51,1,"Error creating Map.");
            }
          }
          else {
            do {
              iVar2 = STRING_TOKENIZER_get_next_token(tokenizer,output,"=");
              if (iVar2 != 0) break;
              iVar2 = STRING_TOKENIZER_get_next_token(tokenizer,output_00,";");
              if (iVar2 == 0) {
                pcVar5 = STRING_c_str(output);
                if ((pcVar5 == (char *)0x0) || (*pcVar5 == '\0')) {
                  p_Var4 = xlogging_get_log_function();
                  if (p_Var4 != (LOGGER_LOG)0x0) {
                    iVar2 = 0x6d;
                    pcVar5 = "The key token is NULL or empty.";
                    goto LAB_00167389;
                  }
                  goto LAB_0016738e;
                }
                value = STRING_c_str(output_00);
                if (value == (char *)0x0) {
                  p_Var4 = xlogging_get_log_function();
                  if (p_Var4 != (LOGGER_LOG)0x0) {
                    iVar2 = 0x77;
                    pcVar5 = "Could not get C string for value token.";
                    goto LAB_00167389;
                  }
                  goto LAB_0016738e;
                }
                MVar3 = Map_Add(handle,pcVar5,value);
                bVar1 = true;
                if (MVar3 != MAP_OK) {
                  p_Var4 = xlogging_get_log_function();
                  if (p_Var4 != (LOGGER_LOG)0x0) {
                    iVar2 = 0x80;
                    pcVar5 = "Could not add the key/value pair to the result map.";
                    goto LAB_00167389;
                  }
                  goto LAB_0016738e;
                }
              }
              else {
                p_Var4 = xlogging_get_log_function();
                if (p_Var4 != (LOGGER_LOG)0x0) {
                  iVar2 = 0x61;
                  pcVar5 = "Error reading value token from the connection string.";
LAB_00167389:
                  (*p_Var4)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/connection_string_parser.c"
                            ,"connectionstringparser_parse",iVar2,1,pcVar5);
                }
LAB_0016738e:
                p_Var4 = xlogging_get_log_function();
                if (p_Var4 != (LOGGER_LOG)0x0) {
                  (*p_Var4)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/connection_string_parser.c"
                            ,"connectionstringparser_parse",0x88,1,
                            "Error parsing connection string.");
                }
                Map_Destroy(handle);
                handle = (MAP_HANDLE)0x0;
                bVar1 = false;
              }
            } while (bVar1);
          }
          STRING_delete(output_00);
        }
        STRING_delete(output);
      }
      STRING_TOKENIZER_destroy(tokenizer);
      return handle;
    }
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return (MAP_HANDLE)0x0;
    }
    pcVar5 = "Error creating STRING tokenizer.";
    iVar2 = 0x36;
  }
  (*p_Var4)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/connection_string_parser.c"
            ,"connectionstringparser_parse",iVar2,1,pcVar5);
  return (MAP_HANDLE)0x0;
}

Assistant:

MAP_HANDLE connectionstringparser_parse(STRING_HANDLE connection_string)
{
    MAP_HANDLE result;

    if (connection_string == NULL)
    {
        /* Codes_SRS_CONNECTIONSTRINGPARSER_01_002: [If connection_string is NULL then connectionstringparser_parse shall fail and return NULL.] */
        result = NULL;
        LogError("NULL connection string passed to tokenizer.");
    }
    else
    {
        /* Codes_SRS_CONNECTIONSTRINGPARSER_01_003: [connectionstringparser_parse shall create a STRING tokenizer to be used for parsing the connection string, by calling STRING_TOKENIZER_create.] */
        /* Codes_SRS_CONNECTIONSTRINGPARSER_01_004: [connectionstringparser_parse shall start scanning at the beginning of the connection string.] */
        STRING_TOKENIZER_HANDLE tokenizer = STRING_TOKENIZER_create(connection_string);
        if (tokenizer == NULL)
        {
            /* Codes_SRS_CONNECTIONSTRINGPARSER_01_015: [If STRING_TOKENIZER_create fails, connectionstringparser_parse shall fail and return NULL.] */
            result = NULL;
            LogError("Error creating STRING tokenizer.");
        }
        else
        {
            /* Codes_SRS_CONNECTIONSTRINGPARSER_01_016: [2 STRINGs shall be allocated in order to hold the to be parsed key and value tokens.] */
            STRING_HANDLE token_key_string = STRING_new();
            if (token_key_string == NULL)
            {
                /* Codes_SRS_CONNECTIONSTRINGPARSER_01_017: [If allocating the STRINGs fails connectionstringparser_parse shall fail and return NULL.] */
                result = NULL;
                LogError("Error creating key token STRING.");
            }
            else
            {
                STRING_HANDLE token_value_string = STRING_new();
                if (token_value_string == NULL)
                {
                    /* Codes_SRS_CONNECTIONSTRINGPARSER_01_017: [If allocating the STRINGs fails connectionstringparser_parse shall fail and return NULL.] */
                    result = NULL;
                    LogError("Error creating value token STRING.");
                }
                else
                {
                    result = Map_Create(NULL);
                    if (result == NULL)
                    {
                        /* Codes_SRS_CONNECTIONSTRINGPARSER_01_018: [If creating the result map fails, then connectionstringparser_parse shall return NULL.] */
                        LogError("Error creating Map.");
                    }
                    else
                    {
                        /* Codes_SRS_CONNECTIONSTRINGPARSER_01_005: [The following actions shall be repeated until parsing is complete:] */
                        /* Codes_SRS_CONNECTIONSTRINGPARSER_01_006: [connectionstringparser_parse shall find a token (the key of the key/value pair) delimited by the = character, by calling STRING_TOKENIZER_get_next_token.] */
                        /* Codes_SRS_CONNECTIONSTRINGPARSER_01_007: [If STRING_TOKENIZER_get_next_token fails, parsing shall be considered complete.] */
                        while (STRING_TOKENIZER_get_next_token(tokenizer, token_key_string, "=") == 0)
                        {
                            bool is_error = false;

                            /* Codes_SRS_CONNECTIONSTRINGPARSER_01_008: [connectionstringparser_parse shall find a token (the value of the key/value pair) delimited by the ; character, by calling STRING_TOKENIZER_get_next_token.] */
                            if (STRING_TOKENIZER_get_next_token(tokenizer, token_value_string, ";") != 0)
                            {
                                /* Codes_SRS_CONNECTIONSTRINGPARSER_01_009: [If STRING_TOKENIZER_get_next_token fails, connectionstringparser_parse shall fail and return NULL (freeing the allocated result map).] */
                                is_error = true;
                                LogError("Error reading value token from the connection string.");
                            }
                            else
                            {
                                /* Codes_SRS_CONNECTIONSTRINGPARSER_01_011: [The C strings for the key and value shall be extracted from the previously parsed STRINGs by using STRING_c_str.] */
                                const char* token = STRING_c_str(token_key_string);
                                /* Codes_SRS_CONNECTIONSTRINGPARSER_01_013: [If STRING_c_str fails then connectionstringparser_parse shall fail and return NULL (freeing the allocated result map).] */
                                if ((token == NULL) ||
                                    /* Codes_SRS_CONNECTIONSTRINGPARSER_01_019: [If the key length is zero then connectionstringparser_parse shall fail and return NULL (freeing the allocated result map).] */
                                    (strlen(token) == 0))
                                {
                                    is_error = true;
                                    LogError("The key token is NULL or empty.");
                                }
                                else
                                {
                                    /* Codes_SRS_CONNECTIONSTRINGPARSER_01_011: [The C strings for the key and value shall be extracted from the previously parsed STRINGs by using STRING_c_str.] */
                                    const char* value = STRING_c_str(token_value_string);
                                    if (value == NULL)
                                    {
                                        /* Codes_SRS_CONNECTIONSTRINGPARSER_01_013: [If STRING_c_str fails then connectionstringparser_parse shall fail and return NULL (freeing the allocated result map).] */
                                        is_error = true;
                                        LogError("Could not get C string for value token.");
                                    }
                                    else
                                    {
                                        /* Codes_SRS_CONNECTIONSTRINGPARSER_01_010: [The key and value shall be added to the result map by using Map_Add.] */
                                        if (Map_Add(result, token, value) != MAP_OK)
                                        {
                                            /* Codes_SRS_CONNECTIONSTRINGPARSER_01_012: [If Map_Add fails connectionstringparser_parse shall fail and return NULL (freeing the allocated result map).] */
                                            is_error = true;
                                            LogError("Could not add the key/value pair to the result map.");
                                        }
                                    }
                                }
                            }

                            if (is_error)
                            {
                                LogError("Error parsing connection string.");
                                Map_Destroy(result);
                                result = NULL;
                                break;
                            }
                        }
                    }

                    STRING_delete(token_value_string);
                }

                STRING_delete(token_key_string);
            }

            /* Codes_SRS_CONNECTIONSTRINGPARSER_01_014: [After the parsing is complete the previously allocated STRINGs and STRING tokenizer shall be freed by calling STRING_TOKENIZER_destroy.] */
            STRING_TOKENIZER_destroy(tokenizer);
        }
    }

    return result;
}